

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragIntRange2
               (char *label,int *v_current_min,int *v_current_max,float v_speed,int v_min,int v_max,
               char *format,char *format_max)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  int v_min_00;
  ImGuiWindow *pIVar4;
  char *text_end;
  float w_full;
  char *local_90;
  int local_84;
  int local_6c;
  int local_64;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *format_local;
  int v_max_local;
  int v_min_local;
  float v_speed_local;
  int *v_current_max_local;
  int *v_current_min_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    PushID(label);
    BeginGroup();
    w_full = CalcItemWidth();
    PushMultiItemsWidths(2,w_full);
    if (v_min < v_max) {
      local_6c = ImMin<int>(v_max,*v_current_max);
      local_64 = v_min;
    }
    else {
      local_64 = -0x80000000;
      local_6c = *v_current_max;
    }
    bVar2 = DragInt("##min",v_current_min,v_speed,local_64,local_6c,format);
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    if (v_min < v_max) {
      v_min_00 = ImMax<int>(v_min,*v_current_min);
      local_84 = v_max;
    }
    else {
      v_min_00 = *v_current_min;
      local_84 = 0x7fffffff;
    }
    local_90 = format;
    if (format_max != (char *)0x0) {
      local_90 = format_max;
    }
    bVar3 = DragInt("##max",v_current_max,v_speed,v_min_00,local_84,local_90);
    label_local._7_1_ = bVar2 || bVar3;
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextEx(label,text_end,0);
    EndGroup();
    PopID();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragIntRange2(const char* label, int* v_current_min, int* v_current_max, float v_speed, int v_min, int v_max, const char* format, const char* format_max)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    bool value_changed = DragInt("##min", v_current_min, v_speed, (v_min >= v_max) ? INT_MIN : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragInt("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? INT_MAX : v_max, format_max ? format_max : format);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}